

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  xmlChar xVar1;
  int iVar2;
  xmlElementContentType xVar3;
  _xmlElementContent *p_Var4;
  bool bVar5;
  byte bVar6;
  xmlElementContentPtr pxVar7;
  _xmlElementContent *p_Var8;
  xmlElementContentPtr cur;
  xmlChar *pxVar9;
  xmlParserInputPtr pxVar10;
  byte bVar11;
  long lVar12;
  byte bVar13;
  xmlElementContentPtr pxVar14;
  xmlElementContentPtr pxVar15;
  
  if ((0x80 < depth) && ((0x800 < (uint)depth || ((ctxt->options & 0x80000U) == 0)))) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,
                      "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n"
                      ,depth);
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankChars(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (*ctxt->input->cur == '(') {
    iVar2 = ctxt->input->id;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    pxVar7 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar2,depth + 1);
    xmlSkipBlankChars(ctxt);
    if (ctxt->progressive != 0) goto LAB_00162277;
    lVar12 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  else {
    pxVar9 = xmlParseName(ctxt);
    if (pxVar9 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    pxVar7 = xmlNewDocElementContent(ctxt->myDoc,pxVar9,XML_ELEMENT_CONTENT_ELEMENT);
    if (pxVar7 == (xmlElementContentPtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    pxVar10 = ctxt->input;
    if ((ctxt->progressive == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
      xmlGROW(ctxt);
      pxVar10 = ctxt->input;
    }
    xVar1 = *pxVar10->cur;
    if (xVar1 == '*') {
      pxVar7->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_0016223f:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar1 == '+') {
        pxVar7->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_0016223f;
      }
      if (xVar1 == '?') {
        pxVar7->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_0016223f;
      }
      pxVar7->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    if (ctxt->progressive != 0) goto LAB_00162277;
    lVar12 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  if (lVar12 < 0xfa) {
    xmlGROW(ctxt);
  }
LAB_00162277:
  xmlSkipBlankChars(ctxt);
  pxVar10 = ctxt->input;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar10->cur - (long)pxVar10->base)) &&
     ((long)pxVar10->end - (long)pxVar10->cur < 500)) {
    xmlSHRINK(ctxt);
    pxVar10 = ctxt->input;
  }
  p_Var8 = pxVar7;
  if (*pxVar10->cur != 0x29) {
    if (ctxt->instate == XML_PARSER_EOF) {
      cur = (_xmlElementContent *)0x0;
    }
    else {
      cur = (xmlElementContentPtr)0x0;
      pxVar14 = pxVar7;
      pxVar15 = pxVar7;
      bVar6 = *pxVar10->cur;
      bVar11 = 0;
      do {
        bVar13 = bVar6;
        pxVar7 = pxVar14;
        if (bVar13 != 0x7c) {
          if (bVar13 == 0x2c) {
            if ((bVar11 == 0) || (bVar11 == 0x2c)) {
              xmlNextChar(ctxt);
              p_Var8 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
              if (p_Var8 == (xmlElementContentPtr)0x0) {
                if ((cur != (xmlElementContentPtr)0x0) && (cur != pxVar14)) {
                  xmlFreeDocElementContent(ctxt->myDoc,cur);
                }
                goto LAB_00162690;
              }
              goto LAB_00162364;
            }
            goto LAB_00162661;
          }
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
LAB_00162675:
          if ((cur != (xmlElementContentPtr)0x0) && (cur != pxVar14)) {
            xmlFreeDocElementContent(ctxt->myDoc,cur);
          }
LAB_0016268b:
          pxVar7 = pxVar14;
          if (pxVar14 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
LAB_00162690:
          xmlFreeDocElementContent(ctxt->myDoc,pxVar7);
          return (xmlElementContentPtr)0x0;
        }
        if ((bVar11 != 0) && (bVar11 != 0x7c)) {
LAB_00162661:
          xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                            "xmlParseElementChildrenContentDecl : \'%c\' expected\n",(uint)bVar11);
          goto LAB_00162675;
        }
        xmlNextChar(ctxt);
        p_Var8 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
        if (p_Var8 == (xmlElementContentPtr)0x0) goto LAB_00162675;
LAB_00162364:
        if (cur == (xmlElementContentPtr)0x0) {
          p_Var8->c1 = pxVar14;
          pxVar7 = p_Var8;
          if (pxVar14 != (xmlElementContentPtr)0x0) goto LAB_00162389;
        }
        else {
          pxVar15->c2 = p_Var8;
          p_Var8->parent = pxVar15;
          p_Var8->c1 = cur;
          pxVar14 = cur;
LAB_00162389:
          pxVar14->parent = p_Var8;
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        xmlSkipBlankChars(ctxt);
        pxVar10 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar10 = ctxt->input;
        }
        pxVar14 = pxVar7;
        if (*pxVar10->cur != '(') {
          pxVar9 = xmlParseName(ctxt);
          if (pxVar9 == (xmlChar *)0x0) {
            xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
            if (pxVar7 == (xmlElementContentPtr)0x0) {
              return (xmlElementContentPtr)0x0;
            }
            goto LAB_00162690;
          }
          cur = xmlNewDocElementContent(ctxt->myDoc,pxVar9,XML_ELEMENT_CONTENT_ELEMENT);
          if (cur != (xmlElementContentPtr)0x0) {
            xVar1 = *ctxt->input->cur;
            if (xVar1 == '*') {
              cur->ocur = XML_ELEMENT_CONTENT_MULT;
            }
            else if (xVar1 == '+') {
              cur->ocur = XML_ELEMENT_CONTENT_PLUS;
            }
            else {
              if (xVar1 != '?') {
                cur->ocur = XML_ELEMENT_CONTENT_ONCE;
                goto LAB_00162496;
              }
              cur->ocur = XML_ELEMENT_CONTENT_OPT;
            }
            xmlNextChar(ctxt);
            goto LAB_00162496;
          }
          goto LAB_0016268b;
        }
        iVar2 = pxVar10->id;
        xmlNextChar(ctxt);
        xmlSkipBlankChars(ctxt);
        cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar2,depth + 1);
        xmlSkipBlankChars(ctxt);
LAB_00162496:
        xmlSkipBlankChars(ctxt);
        pxVar10 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar10 = ctxt->input;
        }
      } while ((*pxVar10->cur != 0x29) &&
              (pxVar15 = p_Var8, bVar6 = *pxVar10->cur, bVar11 = bVar13,
              ctxt->instate != XML_PARSER_EOF));
    }
    if ((p_Var8 != (xmlElementContentPtr)0x0) && (cur != (_xmlElementContent *)0x0)) {
      p_Var8->c2 = cur;
      cur->parent = p_Var8;
    }
  }
  if (pxVar10->id != inputchk) {
    xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                   "Element content declaration doesn\'t start and stop in the same entity\n");
  }
  xmlNextChar(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '*') {
    if (pxVar7 != (xmlElementContentPtr)0x0) {
      pxVar7->ocur = XML_ELEMENT_CONTENT_MULT;
      xVar3 = pxVar7->type;
      p_Var8 = pxVar7;
      while (xVar3 == XML_ELEMENT_CONTENT_OR) {
        p_Var4 = p_Var8->c1;
        if ((p_Var4 != (_xmlElementContent *)0x0) &&
           ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        p_Var8 = p_Var8->c2;
        if (p_Var8 == (_xmlElementContent *)0x0) break;
        if ((p_Var8->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var8->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        xVar3 = p_Var8->type;
      }
    }
  }
  else if (xVar1 == '+') {
    if (((pxVar7 != (xmlElementContentPtr)0x0) &&
        (pxVar7->ocur = ((pxVar7->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
                        XML_ELEMENT_CONTENT_MULT, p_Var8 != (xmlElementContentPtr)0x0)) &&
       (p_Var8->type == XML_ELEMENT_CONTENT_OR)) {
      bVar5 = false;
      do {
        p_Var4 = p_Var8->c1;
        if ((p_Var4 != (_xmlElementContent *)0x0) &&
           ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar5 = true;
        }
        p_Var8 = p_Var8->c2;
        if (p_Var8 == (_xmlElementContent *)0x0) break;
        if ((p_Var8->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var8->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar5 = true;
        }
      } while (p_Var8->type == XML_ELEMENT_CONTENT_OR);
      if (bVar5) {
        pxVar7->ocur = XML_ELEMENT_CONTENT_MULT;
      }
    }
  }
  else {
    if (xVar1 != '?') {
      return pxVar7;
    }
    if (pxVar7 != (xmlElementContentPtr)0x0) {
      pxVar7->ocur = (pxVar7->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
    }
  }
  xmlNextChar(ctxt);
  return pxVar7;
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    DEBUG_ENTER(("xmlParseElementChildrenContentDeclPriv(%s, %d, %d);\n", dbgCtxt(ctxt), inputchk, depth));

    if (((depth > 128) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (depth >  2048)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED,
"xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
                          depth);
	RETURN_PTR(NULL);
    }
    SKIP_BLANKS;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
	SKIP_BLANKS;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    RETURN_PTR(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    RETURN_PTR(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS;
    SHRINK;
    while ((RAW != ')') && (ctxt->instate != XML_PARSER_EOF)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    RETURN_PTR(NULL);
	}
	GROW;
	SKIP_BLANKS;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
	    SKIP_BLANKS;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    RETURN_PTR(ret);
}